

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::findKBest
          (Model *this,int32_t k,real threshold,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  float fVar1;
  iterator __position;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var2;
  pair<float,_int> __value;
  undefined4 extraout_var;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  pair<float,_int> local_40;
  real local_34;
  
  local_34 = threshold;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loss ==
      ova) {
    computeOutputSigmoid(this,hidden,output);
  }
  else {
    computeOutputSoftmax(this,hidden,output);
  }
  if (0 < this->osz_) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      fVar1 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      if (local_34 <= fVar1) {
        if ((long)(heap->
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(heap->
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
          dVar6 = ::log((double)fVar1 + 1e-05);
          if ((float)dVar6 <
              ((heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start)->first) goto LAB_0012564c;
          fVar1 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4];
        }
        dVar6 = ::log((double)fVar1 + 1e-05);
        local_40 = (pair<float,_int>)(CONCAT44(extraout_var,(float)dVar6) + lVar5);
        __position._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (heap->
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
          _M_realloc_insert<std::pair<float,int>>
                    ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                     __position,&local_40);
          ppVar3 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = local_40;
          ppVar3 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
        }
        _Var2._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        local_40 = (pair<float,_int>)comparePairs;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                  (_Var2,((long)ppVar3 - (long)_Var2._M_current >> 3) + -1,0,ppVar3[-1],
                   (_Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                    *)&local_40);
        ppVar3 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var2._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(long)k < (ulong)((long)ppVar3 - (long)_Var2._M_current >> 3)) {
          if (8 < (long)ppVar3 - (long)_Var2._M_current) {
            __value = ppVar3[-1];
            ppVar3[-1].first = (_Var2._M_current)->first;
            ppVar3[-1].second = (_Var2._M_current)->second;
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                      (_Var2,0,(long)ppVar3 + (-8 - (long)_Var2._M_current) >> 3,__value,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                        )0x1250ee);
            ppVar3 = (heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar3 + -1;
        }
      }
LAB_0012564c:
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x100000000;
    } while (lVar4 < this->osz_);
  }
  return;
}

Assistant:

void Model::findKBest(
		int32_t k,
		real threshold,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden,
		Vector& output) const {
	if (args_->loss == loss_name::ova) {
		computeOutputSigmoid(hidden, output);
	} else {
		computeOutputSoftmax(hidden, output);
	}
	for (int32_t i = 0; i < osz_; i++) {
		if (output[i] < threshold) {
			continue;
		}
		if (heap.size() == k && std_log(output[i]) < heap.front().first) {
			continue;
		}
		heap.push_back(std::make_pair(std_log(output[i]), i));
		std::push_heap(heap.begin(), heap.end(), comparePairs);
		if (heap.size() > k) {
			std::pop_heap(heap.begin(), heap.end(), comparePairs);
			heap.pop_back();
		}
	}
}